

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

size_t MeCab::
       tokenizeCSV<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                 (char *str,
                 back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 out,size_t max)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  allocator local_61;
  size_t local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out.container;
  sVar3 = strlen(str);
  pcVar7 = str + sVar3;
  sVar8 = 0;
  local_60 = max;
  do {
    if (pcVar7 <= str) {
      return sVar8;
    }
    for (; (cVar2 = *str, cVar2 == '\t' || (cVar2 == ' ')); str = str + 1) {
    }
    if (cVar2 == '\"') {
      str = str + 1;
      pcVar5 = str;
      pcVar6 = str;
      while ((pcVar5 < pcVar7 &&
             ((cVar2 = *pcVar5, pcVar4 = pcVar5, cVar2 != '\"' ||
              (pcVar4 = pcVar5 + 1, pcVar1 = pcVar5 + 1, pcVar5 = pcVar4, *pcVar1 == '\"'))))) {
        *pcVar6 = cVar2;
        pcVar6 = pcVar6 + 1;
        pcVar5 = pcVar4 + 1;
      }
      local_50._M_dataplus._M_p._0_1_ = 0x2c;
      pcVar5 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (pcVar5,pcVar7,&local_50);
    }
    else {
      local_50._M_dataplus._M_p._0_1_ = 0x2c;
      pcVar6 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (str,pcVar7,&local_50);
      pcVar5 = pcVar6;
    }
    if (1 < max) {
      *pcVar6 = '\0';
    }
    std::__cxx11::string::string((string *)&local_50,str,&local_61);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_58,&local_50);
    max = max - 1;
    std::__cxx11::string::~string((string *)&local_50);
    sVar8 = sVar8 + 1;
    str = pcVar5 + 1;
  } while (max != 0);
  return local_60;
}

Assistant:

inline size_t tokenizeCSV(char *str,
                          Iterator out, size_t max) {
  char *eos = str + std::strlen(str);
  char *start = 0;
  char *end = 0;
  size_t n = 0;

  for (; str < eos; ++str) {
    // skip white spaces
     while (*str == ' ' || *str == '\t') ++str;
    if (*str == '"') {
      start = ++str;
      end = start;
      for (; str < eos; ++str) {
        if (*str == '"') {
          str++;
          if (*str != '"')
            break;
        }
        *end++ = *str;
      }
      str = std::find(str, eos, ',');
    } else {
      start = str;
      str = std::find(str, eos, ',');
      end = str;
    }
    if (max-- > 1) *end = '\0';
    *out++ = start;
    ++n;
    if (max == 0) break;
  }

  return n;
}